

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkCallFromRoot(CheckerVisitor *this,CallExpr *call)

{
  pointer pSVar1;
  undefined8 *puVar2;
  int iVar3;
  SQChar *__s1;
  pointer pSVar4;
  undefined8 *puVar5;
  bool bVar6;
  
  if ((this->effectsOnly == false) &&
     (__s1 = extractFunctionName(this,call), puVar2 = DAT_001aa100,
     puVar5 = SQCompilationContext::function_must_be_called_from_root_abi_cxx11_,
     __s1 != (SQChar *)0x0)) {
    bVar6 = SQCompilationContext::function_must_be_called_from_root_abi_cxx11_ == DAT_001aa100;
    if (bVar6) {
LAB_0015384f:
      if (bVar6) {
        return;
      }
    }
    else {
      iVar3 = strcmp(__s1,(char *)*SQCompilationContext::
                                   function_must_be_called_from_root_abi_cxx11_);
      while (iVar3 != 0) {
        puVar5 = puVar5 + 4;
        bVar6 = puVar5 == puVar2;
        if (bVar6) goto LAB_0015384f;
        iVar3 = strcmp(__s1,(char *)*puVar5);
      }
    }
    pSVar1 = (this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar4 != pSVar1) {
      do {
        if ((pSVar4[-1].sst != SST_TABLE_MEMBER) && ((pSVar4[-1].field_1.n)->_op - TO_FUNCTION < 3))
        {
          bVar6 = true;
          break;
        }
        bVar6 = false;
        pSVar4 = pSVar4 + -1;
      } while (pSVar4 != pSVar1);
      if (bVar6) {
        report(this,(Node *)call,0x83,__s1);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCallFromRoot(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *fn = extractFunctionName(call);

  if (!fn)
    return;

  if (!nameLooksLikeMustBeCalledFromRoot(fn)) {
    return;
  }

  bool do_report = false;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst == SST_TABLE_MEMBER)
      continue;

    enum TreeOp op = it->n->op();

    if (op == TO_FUNCTION || op == TO_CLASS || op == TO_CONSTRUCTOR) {
      do_report = true;
      break;
    }
  }

  if (do_report) {
    report(call, DiagnosticsId::DI_CALL_FROM_ROOT, fn);
  }
}